

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O2

void dirLUA(void)

{
  lua_State *L;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *__dest;
  EWStatus EVar4;
  EWStatus EVar5;
  undefined4 uVar6;
  undefined8 unaff_RBP;
  char *pcVar7;
  size_t size;
  EWStatus EVar8;
  bool bVar9;
  char *id;
  char *local_60;
  EWStatus warningType;
  EWStatus local_50;
  undefined4 local_4c;
  TextFilePos luaStartPos;
  
  if ((LUA == (lua_State *)0x0) && (lua_impl_init(), LUA == (lua_State *)0x0)) {
    __assert_fail("LUA",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/lua_sjasm.cpp"
                  ,0x1d2,"void dirLUA()");
  }
  id = GetID(&lp);
  uVar6 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  EVar4 = W_PASS03;
  if ((id == (char *)0x0) || (*id == '\0')) {
LAB_00119584:
    EVar8 = W_PASS3;
    bVar2 = false;
    EVar5 = EVar4;
  }
  else {
    bVar2 = false;
    iVar3 = cmphstr(&id,"pass1",false);
    EVar8 = W_EARLY;
    if (iVar3 != 0) {
      EVar4 = W_PASS3;
      EVar5 = EVar8;
      goto LAB_00119587;
    }
    iVar3 = cmphstr(&id,"pass2",false);
    if (iVar3 == 0) {
      iVar3 = cmphstr(&id,"pass3",false);
      EVar8 = W_PASS3;
      if (iVar3 != 0) goto LAB_00119584;
      uVar6 = 0;
      iVar3 = cmphstr(&id,"allpass",false);
      if (iVar3 != 0) {
        bVar2 = true;
        EVar5 = ~W_ALL;
        goto LAB_00119587;
      }
      EVar4 = W_PASS03;
      Error("[LUA] Syntax error",id,PASS3);
      uVar6 = 1;
    }
    else {
      EVar4 = W_PASS3;
    }
    bVar2 = false;
    EVar5 = EVar4;
  }
LAB_00119587:
  bVar9 = EVar5 == pass;
  bVar1 = suppressedById(W_LUA_MC_PASS);
  if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_start ==
      sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("!sourcePosStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/lua_sjasm.cpp"
                  ,0x1eb,"void dirLUA()");
  }
  luaStartPos.colEnd =
       sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].colEnd;
  luaStartPos._20_4_ =
       *(undefined4 *)
        &sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].field_0x14;
  luaStartPos.filename =
       sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].filename;
  luaStartPos.line =
       sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].line;
  luaStartPos.colBegin =
       sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].colBegin;
  warningType = EVar8;
  local_50 = EVar4;
  local_4c = uVar6;
  if (bVar2 || bVar9) {
    __dest = (char *)operator_new__(0x8000);
  }
  else {
    __dest = (char *)0x0;
  }
  ListFile(false);
  local_60 = __dest;
  do {
    iVar3 = ReadLine(false);
    if (iVar3 == 0) {
      Error("[LUA] Unexpected end of lua script",(char *)0x0,PASS3);
LAB_00119727:
      if (bVar2 || bVar9) {
        extraErrorWarningPrefix = "[LUA] ";
        *__dest = '\0';
        DidEmitByte();
        pcVar7 = local_60;
        L = LUA;
        size = (long)__dest - (long)local_60;
        lua_impl_get_script_name(&luaStartPos);
        iVar3 = luaL_loadbufferx(L,pcVar7,size,internal_script_name,(char *)0x0);
        if ((iVar3 != 0) || (iVar3 = lua_pcallk(LUA,0,-1,0,0,(lua_KFunction)0x0), iVar3 != 0)) {
          lua_impl_showLoadError(local_50);
        }
        extraErrorWarningPrefix = (char *)0x0;
        if (local_60 != (char *)0x0) {
          operator_delete__(local_60);
        }
        bVar2 = DidEmitByte();
        if (bVar1 == false && ((byte)local_4c & bVar2) == 1) {
          WarningById(W_LUA_MC_PASS,(char *)0x0,warningType);
        }
      }
      CompiledCurrentLine = CompiledCurrentLine + 1;
      substitutedLine = line;
      return;
    }
    lp = line;
    SkipBlanks(&lp);
    iVar3 = cmphstr(&lp,"endlua",false);
    if (iVar3 == 0) {
      pcVar7 = (char *)strlen(line);
    }
    else {
      pcVar7 = lp + -0x18aa26;
    }
    if (bVar2 || bVar9) {
      if (pcVar7 + (long)(__dest + (-0x7ffd - (long)local_60)) < (char *)0xffffffffffff7fff) {
        ErrorInt("[LUA] Maximum byte-size of Lua script is",0x7ffc,FATAL);
      }
      memcpy(__dest,line,(size_t)pcVar7);
      pcVar7 = __dest + (long)pcVar7;
      __dest = pcVar7 + 1;
      *pcVar7 = '\n';
    }
    if (iVar3 != 0) {
      skipEmitMessagePos.filename =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].filename;
      skipEmitMessagePos.line =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].line;
      skipEmitMessagePos.colBegin =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].colBegin;
      skipEmitMessagePos.colEnd =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].colEnd;
      CompiledCurrentLine = CompiledCurrentLine + 1;
      lp = ReplaceDefine(lp);
      substitutedLine = line;
      if (bVar1) {
        bVar1 = true;
      }
      else {
        bVar1 = suppressedById(W_LUA_MC_PASS);
      }
      goto LAB_00119727;
    }
    ListFile(true);
  } while( true );
}

Assistant:

void dirLUA() {
	// lazy init of Lua scripting upon first hit of LUA directive
	if (nullptr == LUA) lua_impl_init();
	assert(LUA);

	constexpr size_t luaBufferSize = 32768;
	char* id, * buff = nullptr, * bp = nullptr;

	int passToExec = LASTPASS;
	if ((id = GetID(lp)) && strlen(id) > 0) {
		if (cmphstr(id, "pass1")) {
			passToExec = 1;
		} else if (cmphstr(id, "pass2")) {
			passToExec = 2;
		} else if (cmphstr(id, "pass3")) {
			passToExec = LASTPASS;
		} else if (cmphstr(id, "allpass")) {
			passToExec = -1;
		} else {
			Error("[LUA] Syntax error", id);
		}
	}

	const EStatus errorType = (1 == passToExec || 2 == passToExec) ? EARLY : PASS3;
	const bool execute = (-1 == passToExec) || (passToExec == pass);
	// remember warning suppression also from block start
	bool showWarning = !suppressedById(W_LUA_MC_PASS);

	assert(!sourcePosStack.empty());
	TextFilePos luaStartPos = sourcePosStack.back();	// position of LUA directive (not ENDLUA)
	if (execute) {
		buff = new char[luaBufferSize];
		bp = buff;
	}
	ListFile();

	while (1) {
		if (!ReadLine(false)) {
			Error("[LUA] Unexpected end of lua script");
			break;
		}
		lp = line;
		SkipBlanks(lp);
		const int isEndLua = cmphstr(lp, "endlua");
		const size_t lineLen = isEndLua ? (lp - 6 - line) : strlen(line);
		if (execute) {
			if (luaBufferSize < (bp - buff) + lineLen + 4) {
				ErrorInt("[LUA] Maximum byte-size of Lua script is", luaBufferSize-4, FATAL);
			}
			memcpy(bp, line, lineLen);
			bp += lineLen;
			*bp++ = '\n';
		}
		if (isEndLua) {		// eat also any trailing eol-type of comment
			skipEmitMessagePos = sourcePosStack.back();
			++CompiledCurrentLine;
			lp = ReplaceDefine(lp);		// skip any empty substitutions and comments
			substitutedLine = line;		// override substituted listing for ENDLUA
			// take into account also warning suppression used at end of block
			showWarning = showWarning && !suppressedById(W_LUA_MC_PASS);
			break;
		}
		ListFile(true);
	}

	if (execute) {
		extraErrorWarningPrefix = lua_err_prefix;
		*bp = 0;
		DidEmitByte();			// reset the flag before running lua script
		if (luaL_loadbuffer(LUA, buff, bp-buff, lua_impl_get_script_name(luaStartPos)) || lua_pcall(LUA, 0, LUA_MULTRET, 0)) {
			lua_impl_showLoadError(errorType);
		}
		extraErrorWarningPrefix = nullptr;
		delete[] buff;
		if (DidEmitByte() && (-1 != passToExec) && showWarning) {
			const EWStatus warningType = (1 == passToExec || 2 == passToExec) ? W_EARLY : W_PASS3;
			WarningById(W_LUA_MC_PASS, nullptr, warningType);
		}
	}

	++CompiledCurrentLine;
	substitutedLine = line;		// override substituted list line for ENDLUA
}